

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O0

int si9ma::DP::find_way_dp(int *arr,int length,int start,int aim,int step)

{
  bool bVar1;
  undefined1 *puVar2;
  long lVar3;
  undefined1 *puVar4;
  undefined8 uStack_80;
  undefined1 auStack_78 [4];
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  int local_4c;
  int local_48;
  int j;
  int i;
  bool tmp_is_main;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_28;
  int local_24;
  int step_local;
  int aim_local;
  int start_local;
  int length_local;
  int *arr_local;
  
  __vla_expr0 = (unsigned_long)auStack_78;
  if ((((arr == (int *)0x0) || (start < 0)) || (length <= start)) || ((aim < 0 || (length <= aim))))
  {
    arr_local._4_4_ = 0;
  }
  else {
    __vla_expr1 = (unsigned_long)(uint)length;
    puVar4 = auStack_78 + -(__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0);
    _i = (ulong)(uint)length;
    puVar2 = puVar4 + -(_i * 4 + 0xf & 0xfffffffffffffff0);
    local_60 = puVar2;
    local_58 = puVar4;
    local_28 = step;
    local_24 = aim;
    step_local = start;
    aim_local = length;
    _start_local = arr;
    *(undefined8 *)(puVar2 + -8) = 0x11dbfe;
    memset(puVar4,0,(long)length << 2);
    puVar4 = local_60;
    lVar3 = (long)aim_local;
    *(undefined8 *)(puVar2 + -8) = 0x11dc11;
    memset(puVar4,0,lVar3 << 2);
    *(undefined4 *)(local_58 + (long)local_24 * 4) = 1;
    bVar1 = true;
    for (local_48 = 1; local_48 <= local_28; local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < aim_local; local_4c = local_4c + 1) {
        if (bVar1) {
          if (local_4c == 0) {
            local_64 = *(int *)(local_58 + 4);
          }
          else {
            if (local_4c == aim_local + -1) {
              local_68 = *(int *)(local_58 + (long)(local_4c + -1) * 4);
            }
            else {
              local_68 = *(int *)(local_58 + (long)(local_4c + -1) * 4) +
                         *(int *)(local_58 + (long)(local_4c + 1) * 4);
            }
            local_64 = local_68;
          }
          *(int *)(local_60 + (long)local_4c * 4) = local_64;
        }
        else {
          if (local_4c == 0) {
            local_6c = *(int *)(local_60 + 4);
          }
          else {
            if (local_4c == aim_local + -1) {
              local_70 = *(int *)(local_60 + (long)(local_4c + -1) * 4);
            }
            else {
              local_70 = *(int *)(local_60 + (long)(local_4c + -1) * 4) +
                         *(int *)(local_60 + (long)(local_4c + 1) * 4);
            }
            local_6c = local_70;
          }
          *(int *)(local_58 + (long)local_4c * 4) = local_6c;
        }
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (bVar1) {
      local_74 = *(int *)(local_58 + (long)step_local * 4);
    }
    else {
      local_74 = *(int *)(local_60 + (long)step_local * 4);
    }
    arr_local._4_4_ = local_74;
  }
  return arr_local._4_4_;
}

Assistant:

int DP::find_way_dp(int *arr, int length, int start, int aim, int step) {
        if(arr == nullptr || start < 0 || start >= length || aim < 0 || aim >= length)
            return 0;

        int res_arr[length];
        int res_arr_tmp[length];
        memset(res_arr,0, length*sizeof(res_arr[0]));
        memset(res_arr_tmp,0, length*sizeof(res_arr_tmp[0]));

        res_arr[aim] = 1;
        bool tmp_is_main = true;
        for (int i = 1; i <= step ; ++i) {
            for (int j = 0; j < length ; ++j) {
                if (tmp_is_main)
                    res_arr_tmp[j] = j == 0 ? res_arr[j + 1]
                                            : (j == length - 1 ? res_arr[j - 1] : res_arr[j - 1] + res_arr[j + 1]);
                else
                    res_arr[j] = j == 0 ? res_arr_tmp[j + 1]
                                        : (j == length - 1 ? res_arr_tmp[j - 1] : res_arr_tmp[j - 1] + res_arr_tmp[j + 1]);
            }
            tmp_is_main = !tmp_is_main;
        }

        return tmp_is_main ? res_arr[start] : res_arr_tmp[start];
    }